

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_array.cpp
# Opt level: O1

void __thiscall
JsonArray_TrailingCommaDisabled_Test::~JsonArray_TrailingCommaDisabled_Test
          (JsonArray_TrailingCommaDisabled_Test *this)

{
  void *in_RAX;
  
  (this->super_JsonArray).super_Test._vptr_Test = (_func_int **)&PTR__JsonArray_001bd888;
  mock_json_callbacks::~mock_json_callbacks
            (&(this->super_JsonArray).callbacks_.super_mock_json_callbacks);
  testing::Mock::UnregisterCallReaction(in_RAX);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x338);
  return;
}

Assistant:

TEST_F (JsonArray, TrailingCommaDisabled) {
    {
        json::parser<json_out_callbacks> p1;
        p1.input ("[,]"s).eof ();
        EXPECT_EQ (p1.last_error (), make_error_code (json::error_code::expected_token));
        EXPECT_EQ (p1.coordinate (), (json::coord{2U, 1U}));
    }
    {
        json::parser<json_out_callbacks> p2;
        p2.input ("[1,]"s).eof ();
        EXPECT_EQ (p2.last_error (), make_error_code (json::error_code::expected_token));
        EXPECT_EQ (p2.coordinate (), (json::coord{4U, 1U}));
    }
}